

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC4862(CNetAddr *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_10[0] = -2;
    local_10[1] = -0x80;
    local_10[2] = '\0';
    local_10[3] = '\0';
    local_10[4] = '\0';
    local_10[5] = '\0';
    local_10[6] = '\0';
    local_10[7] = '\0';
    uVar3 = (this->m_addr)._size;
    uVar4 = uVar3 - 0x11;
    if (uVar3 < 0x11) {
      uVar4 = uVar3;
    }
    if (7 < uVar4) {
      if (0x10 < uVar3) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((this->m_addr)._union.direct[0] == -2) {
        lVar5 = 1;
        do {
          bVar6 = lVar5 == 8;
          if (bVar6) goto LAB_006a9d8d;
          pcVar2 = local_10 + lVar5;
          pcVar1 = (this->m_addr)._union.direct + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar2 == *pcVar1);
      }
    }
  }
  bVar6 = false;
LAB_006a9d8d:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC4862() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 8>{0xFE, 0x80, 0x00, 0x00,
                                                                0x00, 0x00, 0x00, 0x00});
}